

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pooling.c
# Opt level: O0

float calc_max_generic(pooling_calc_context_t calc)

{
  float fVar1;
  float in_stack_00000008;
  int in_stack_0000000c;
  undefined4 local_24;
  float val_1;
  int kx;
  int jx_1;
  int ix_1;
  float val;
  int jx;
  int ix;
  float max_val;
  
  jx = -0x800001;
  if (calc.wstride == 2) {
    for (val = in_stack_00000008; (int)val < in_stack_0000000c; val = (float)((int)val + 1)) {
      for (ix_1 = (int)val * calc.dstart + calc.hstart; ix_1 < (int)val * calc.dstart + calc.hend;
          ix_1 = ix_1 + 1) {
        fVar1 = (float)(*(code *)calc.x)(calc._32_8_,ix_1 + (int)calc.set_y);
        if ((float)jx < fVar1) {
          jx = (int)fVar1;
        }
      }
    }
  }
  else if (calc.wstride == 3) {
    for (kx = (int)in_stack_00000008; kx < in_stack_0000000c; kx = kx + 1) {
      for (val_1 = (float)calc.hstart; (int)val_1 < calc.hend; val_1 = (float)((int)val_1 + 1)) {
        for (local_24 = calc.wstart; local_24 < calc.wend; local_24 = local_24 + 1) {
          fVar1 = (float)(*(code *)calc.x)(calc._32_8_,
                                           kx * calc.dstart + (int)val_1 * calc.dend + local_24 +
                                           (int)calc.set_y);
          if ((float)jx < fVar1) {
            jx = (int)fVar1;
          }
        }
      }
    }
  }
  return (float)jx;
}

Assistant:

float calc_max_generic(pooling_calc_context_t calc) {
  float max_val = -FLT_MAX;
  if (calc.kernel_size == 2) {
    for (int ix = calc.hstart; ix < calc.hend; ix++) {
      for (int jx = ix * calc.hstride + calc.wstart;
           jx < ix * calc.hstride + calc.wend; jx++) {
        float val = calc.get_x(calc.x, jx + calc.offset_x);
        if (max_val < val) {
          max_val = val;
        }
      }
    }
  } else if (calc.kernel_size == 3) {
    for (int ix = calc.hstart; ix < calc.hend; ix++) {
      for (int jx = calc.wstart; jx < calc.wend; jx++) {
        for (int kx = calc.dstart; kx < calc.dend; kx++) {
          float val = calc.get_x(calc.x, ix * calc.hstride + jx * calc.wstride +
                                             kx + calc.offset_x);
          if (max_val < val) {
            max_val = val;
          }
        }
      }
    }
  }
  return max_val;
}